

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O1

void SparseKeygenRecurse<Blob<112>,unsigned_long>
               (pfHash hash,int start,int bitsleft,bool inclusive,Blob<112> *k,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *hashes)

{
  iterator __position;
  unsigned_long h;
  unsigned_long local_38;
  
  if (start < 0x70) {
    do {
      flipbit(k,0xe,start);
      if (bitsleft == 1 || inclusive) {
        (*hash)(k,0xe,0,&local_38);
        __position._M_current =
             (hashes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (hashes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)hashes,__position,
                     &local_38);
        }
        else {
          *__position._M_current = local_38;
          (hashes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      if (1 < bitsleft) {
        SparseKeygenRecurse<Blob<112>,unsigned_long>
                  (hash,start + 1,bitsleft + -1,inclusive,k,hashes);
      }
      flipbit(k,0xe,start);
      start = start + 1;
    } while (start != 0x70);
  }
  return;
}

Assistant:

void SparseKeygenRecurse ( pfHash hash, int start, int bitsleft, bool inclusive, keytype & k, std::vector<hashtype> & hashes )
{
  const int nbytes = sizeof(keytype);
  const int nbits = nbytes * 8;

  hashtype h;

  for(int i = start; i < nbits; i++)
  {
    flipbit(&k, nbytes, i);

    if(inclusive || (bitsleft == 1))
    {
      hash(&k, sizeof(keytype), 0, &h);
      hashes.push_back(h);
    }

    if(bitsleft > 1)
    {
      SparseKeygenRecurse(hash, i+1, bitsleft-1, inclusive, k, hashes);
    }

    flipbit(&k, nbytes, i);
  }
}